

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O3

void ConvertBGRAToRGBA4444_SSE2(uint32_t *src,int num_pixels,uint8_t *dst)

{
  undefined1 (*pauVar1) [16];
  bool bVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [15];
  unkuint9 Var22;
  undefined1 auVar23 [11];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 *puVar26;
  undefined1 (*pauVar27) [16];
  undefined1 (*pauVar28) [16];
  undefined1 (*pauVar29) [16];
  undefined1 (*pauVar30) [16];
  undefined1 (*pauVar31) [16];
  undefined1 (*pauVar32) [16];
  undefined1 (*pauVar33) [16];
  undefined1 (*pauVar34) [16];
  undefined1 (*pauVar35) [16];
  undefined1 (*pauVar36) [16];
  undefined1 (*pauVar37) [16];
  undefined1 (*pauVar38) [16];
  undefined1 (*pauVar39) [16];
  undefined1 (*pauVar40) [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  __m128i *out;
  uint uVar43;
  __m128i *in;
  byte bVar52;
  byte bVar53;
  byte bVar54;
  byte bVar55;
  byte bVar56;
  byte bVar57;
  byte bVar58;
  undefined1 auVar44 [16];
  byte bVar59;
  undefined1 auVar60 [12];
  short sVar71;
  short sVar72;
  short sVar73;
  undefined1 auVar62 [16];
  undefined1 auVar70 [16];
  ushort uVar74;
  ushort uVar85;
  ushort uVar86;
  byte bVar88;
  ushort uVar87;
  undefined1 auVar75 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar61 [14];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  
  auVar42 = _DAT_001b2c00;
  auVar41 = _DAT_001b2bf0;
  uVar43 = num_pixels;
  if (7 < num_pixels) {
    do {
      auVar84 = *(undefined1 (*) [16])src;
      pauVar1 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar27 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar28 = (undefined1 (*) [16])((long)src + 0x10);
      uVar10 = (*(undefined1 (*) [16])((long)src + 0x10))[3];
      pauVar29 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar30 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar31 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar32 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar33 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar34 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar35 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar36 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar37 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar38 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar39 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar40 = (undefined1 (*) [16])((long)src + 0x10);
      src = (uint32_t *)((long)src + 0x20);
      auVar82._0_14_ = auVar84._0_14_;
      auVar82[0xe] = auVar84[7];
      auVar82[0xf] = (*pauVar32)[7];
      auVar81._14_2_ = auVar82._14_2_;
      auVar81._0_13_ = auVar84._0_13_;
      auVar81[0xd] = (*pauVar31)[6];
      auVar80._13_3_ = auVar81._13_3_;
      auVar80._0_12_ = auVar84._0_12_;
      auVar80[0xc] = auVar84[6];
      auVar79._12_4_ = auVar80._12_4_;
      auVar79._0_11_ = auVar84._0_11_;
      auVar79[0xb] = (*pauVar30)[5];
      auVar78._11_5_ = auVar79._11_5_;
      auVar78._0_10_ = auVar84._0_10_;
      auVar78[10] = auVar84[5];
      auVar77._10_6_ = auVar78._10_6_;
      auVar77._0_9_ = auVar84._0_9_;
      auVar77[9] = (*pauVar29)[4];
      auVar76._9_7_ = auVar77._9_7_;
      auVar76._0_8_ = auVar84._0_8_;
      auVar76[8] = auVar84[4];
      auVar15._1_8_ = auVar76._8_8_;
      auVar15[0] = uVar10;
      auVar15._9_7_ = 0;
      auVar14._10_6_ = 0;
      auVar14._0_10_ = SUB1610(auVar15 << 0x38,6);
      auVar13._11_5_ = 0;
      auVar13._0_11_ = SUB1611(auVar14 << 0x30,5);
      auVar12._12_4_ = 0;
      auVar12._0_12_ = SUB1612(auVar13 << 0x28,4);
      auVar11._13_3_ = 0;
      auVar11._0_13_ = SUB1613(auVar12 << 0x20,3);
      auVar75._14_2_ = 0;
      auVar75._0_14_ = SUB1614(auVar11 << 0x18,2);
      auVar75 = auVar75 << 0x10;
      auVar69._0_14_ = auVar75._0_14_;
      auVar69[0xe] = uVar10;
      auVar69[0xf] = (*pauVar36)[0xb];
      auVar68._14_2_ = auVar69._14_2_;
      auVar68._0_13_ = auVar75._0_13_;
      auVar68[0xd] = auVar84[0xb];
      auVar67._13_3_ = auVar68._13_3_;
      auVar67._0_12_ = auVar75._0_12_;
      auVar67[0xc] = auVar84[3];
      auVar66._12_4_ = auVar67._12_4_;
      auVar66._0_11_ = auVar75._0_11_;
      auVar66[0xb] = (*pauVar35)[10];
      auVar65._11_5_ = auVar66._11_5_;
      auVar65._0_10_ = auVar75._0_10_;
      auVar65[10] = (*pauVar28)[2];
      auVar64._10_6_ = auVar65._10_6_;
      auVar64._0_9_ = auVar75._0_9_;
      auVar64[9] = auVar84[10];
      auVar63._9_7_ = auVar64._9_7_;
      auVar63._0_8_ = auVar75._0_8_;
      auVar63[8] = auVar84[2];
      auVar20._1_8_ = auVar63._8_8_;
      auVar20[0] = (*pauVar34)[9];
      auVar20._9_7_ = 0;
      auVar19._10_6_ = 0;
      auVar19._0_10_ = SUB1610(auVar20 << 0x38,6);
      auVar18._11_5_ = 0;
      auVar18._0_11_ = SUB1611(auVar19 << 0x30,5);
      auVar17._12_4_ = 0;
      auVar17._0_12_ = SUB1612(auVar18 << 0x28,4);
      auVar16._13_3_ = 0;
      auVar16._0_13_ = SUB1613(auVar17 << 0x20,3);
      auVar62._14_2_ = 0;
      auVar62._0_14_ = SUB1614(auVar16 << 0x18,2);
      auVar62 = auVar62 << 0x10;
      auVar51._0_14_ = auVar62._0_14_;
      auVar51[0xe] = (*pauVar34)[9];
      auVar51[0xf] = (*pauVar38)[0xd];
      auVar50._14_2_ = auVar51._14_2_;
      auVar50._0_13_ = auVar62._0_13_;
      auVar50[0xd] = (*pauVar30)[5];
      auVar49._13_3_ = auVar50._13_3_;
      auVar49._0_12_ = auVar62._0_12_;
      auVar49[0xc] = (*pauVar27)[1];
      auVar48._12_4_ = auVar49._12_4_;
      auVar48._0_11_ = auVar62._0_11_;
      auVar48[0xb] = auVar84[0xd];
      auVar47._11_5_ = auVar48._11_5_;
      auVar47._0_10_ = auVar62._0_10_;
      auVar47[10] = auVar84[9];
      auVar46._10_6_ = auVar47._10_6_;
      auVar46._0_9_ = auVar62._0_9_;
      auVar46[9] = auVar84[5];
      auVar45._9_7_ = auVar46._9_7_;
      auVar45._0_8_ = auVar62._0_8_;
      auVar45[8] = auVar84[1];
      auVar44._8_8_ = auVar45._8_8_;
      auVar44[7] = (*pauVar37)[0xc];
      auVar44[6] = (*pauVar33)[8];
      auVar44[5] = (*pauVar29)[4];
      auVar44[4] = (*pauVar1)[0];
      auVar44[3] = auVar84[0xc];
      auVar44[2] = auVar84[8];
      auVar44[1] = auVar84[4];
      auVar44[0] = auVar84[0];
      auVar70._0_8_ =
           CONCAT17((*pauVar39)[0xe],
                    CONCAT16((*pauVar35)[10],
                             CONCAT15((*pauVar31)[6],
                                      CONCAT14((*pauVar28)[2],
                                               CONCAT13(auVar84[0xe],
                                                        CONCAT12(auVar84[10],
                                                                 CONCAT11(auVar84[6],auVar84[2])))))
                            ));
      auVar60._0_10_ = CONCAT19(auVar84[7],CONCAT18(auVar84[3],auVar70._0_8_));
      auVar60[10] = auVar84[0xb];
      auVar60[0xb] = auVar84[0xf];
      auVar61[0xc] = uVar10;
      auVar61._0_12_ = auVar60;
      auVar61[0xd] = (*pauVar32)[7];
      auVar84[0xe] = (*pauVar36)[0xb];
      auVar84._0_14_ = auVar61;
      auVar84[0xf] = (*pauVar40)[0xf];
      auVar70._8_8_ = auVar44._0_8_;
      auVar83._0_2_ = auVar45._8_2_ >> 4;
      auVar83._2_2_ = auVar47._10_2_ >> 4;
      auVar83._4_2_ = auVar49._12_2_ >> 4;
      auVar83._6_2_ = auVar50._14_2_ >> 4;
      auVar83._8_2_ = (ushort)((unkuint10)auVar60._0_10_ >> 0x44);
      auVar83._10_2_ = auVar60._10_2_ >> 4;
      auVar83._12_2_ = auVar61._12_2_ >> 4;
      auVar83._14_2_ = auVar84._14_2_ >> 4;
      auVar84 = auVar83 & auVar42 | auVar70 & auVar41;
      bVar52 = auVar84[8];
      bVar53 = auVar84[9];
      bVar54 = auVar84[10];
      bVar55 = auVar84[0xb];
      bVar56 = auVar84[0xc];
      bVar57 = auVar84[0xd];
      bVar58 = auVar84[0xe];
      bVar59 = auVar84[0xf];
      bVar88 = auVar84[7];
      auVar3[0xd] = 0;
      auVar3._0_13_ = auVar84._0_13_;
      auVar3[0xe] = bVar88;
      auVar4[0xc] = auVar84[6];
      auVar4._0_12_ = auVar84._0_12_;
      auVar4._13_2_ = auVar3._13_2_;
      auVar5[0xb] = 0;
      auVar5._0_11_ = auVar84._0_11_;
      auVar5._12_3_ = auVar4._12_3_;
      auVar6[10] = auVar84[5];
      auVar6._0_10_ = auVar84._0_10_;
      auVar6._11_4_ = auVar5._11_4_;
      auVar7[9] = 0;
      auVar7._0_9_ = auVar84._0_9_;
      auVar7._10_5_ = auVar6._10_5_;
      auVar8[8] = auVar84[4];
      auVar8._0_8_ = auVar84._0_8_;
      auVar8._9_6_ = auVar7._9_6_;
      auVar21._7_8_ = 0;
      auVar21._0_7_ = auVar8._8_7_;
      Var22 = CONCAT81(SUB158(auVar21 << 0x40,7),auVar84[3]);
      auVar24._9_6_ = 0;
      auVar24._0_9_ = Var22;
      auVar23._1_10_ = SUB1510(auVar24 << 0x30,5);
      auVar23[0] = auVar84[2];
      auVar25._11_4_ = 0;
      auVar25._0_11_ = auVar23;
      auVar9[2] = auVar84[1];
      auVar9._0_2_ = auVar84._0_2_;
      auVar9._3_12_ = SUB1512(auVar25 << 0x20,3);
      uVar74 = auVar84._0_2_ & 0xff;
      sVar71 = auVar8._8_2_;
      sVar72 = auVar6._10_2_;
      sVar73 = auVar4._12_2_;
      uVar87 = (ushort)Var22;
      uVar86 = auVar23._0_2_;
      uVar85 = auVar9._2_2_;
      *dst = ((auVar84 & (undefined1  [16])0xff) != (undefined1  [16])0x0) * (uVar74 < 0x100) *
             auVar84[0] - (0xff < uVar74);
      dst[1] = (bVar52 != 0) * (bVar52 < 0x100) * bVar52 - (0xff < bVar52);
      dst[2] = (uVar85 != 0) * (uVar85 < 0x100) * auVar84[1] - (0xff < uVar85);
      dst[3] = (bVar53 != 0) * (bVar53 < 0x100) * bVar53 - (0xff < bVar53);
      dst[4] = (uVar86 != 0) * (uVar86 < 0x100) * auVar84[2] - (0xff < uVar86);
      dst[5] = (bVar54 != 0) * (bVar54 < 0x100) * bVar54 - (0xff < bVar54);
      dst[6] = (uVar87 != 0) * (uVar87 < 0x100) * auVar84[3] - (0xff < uVar87);
      dst[7] = (bVar55 != 0) * (bVar55 < 0x100) * bVar55 - (0xff < bVar55);
      dst[8] = (0 < sVar71) * (sVar71 < 0x100) * auVar84[4] - (0xff < sVar71);
      dst[9] = (bVar56 != 0) * (bVar56 < 0x100) * bVar56 - (0xff < bVar56);
      dst[10] = (0 < sVar72) * (sVar72 < 0x100) * auVar84[5] - (0xff < sVar72);
      dst[0xb] = (bVar57 != 0) * (bVar57 < 0x100) * bVar57 - (0xff < bVar57);
      dst[0xc] = (0 < sVar73) * (sVar73 < 0x100) * auVar84[6] - (0xff < sVar73);
      dst[0xd] = (bVar58 != 0) * (bVar58 < 0x100) * bVar58 - (0xff < bVar58);
      dst[0xe] = (bVar88 != 0) * (bVar88 < 0x100) * bVar88 - (0xff < bVar88);
      dst[0xf] = (bVar59 != 0) * (bVar59 < 0x100) * bVar59 - (0xff < bVar59);
      dst = dst + 0x10;
      num_pixels = uVar43 - 8;
      bVar2 = 0xf < uVar43;
      uVar43 = num_pixels;
    } while (bVar2);
  }
  if (0 < num_pixels) {
    if (0 < num_pixels) {
      puVar26 = *(undefined1 (*) [16])src;
      do {
        uVar43 = *(uint *)*(undefined1 (*) [16])src;
        src = (uint32_t *)(*(undefined1 (*) [16])src + 4);
        *dst = (byte)(uVar43 >> 0xc) & 0xf | (byte)(uVar43 >> 0x10) & 0xf0;
        dst[1] = (byte)(uVar43 >> 0x1c) | (byte)uVar43 & 0xf0;
        dst = dst + 2;
      } while (src < (undefined1 (*) [16])(puVar26 + (long)num_pixels * 4));
    }
    return;
  }
  return;
}

Assistant:

static void ConvertBGRAToRGBA4444_SSE2(const uint32_t* WEBP_RESTRICT src,
                                       int num_pixels,
                                       uint8_t* WEBP_RESTRICT dst) {
  const __m128i mask_0x0f = _mm_set1_epi8(0x0f);
  const __m128i mask_0xf0 = _mm_set1_epi8((char)0xf0);
  const __m128i* in = (const __m128i*)src;
  __m128i* out = (__m128i*)dst;
  while (num_pixels >= 8) {
    const __m128i bgra0 = _mm_loadu_si128(in++);     // bgra0|bgra1|bgra2|bgra3
    const __m128i bgra4 = _mm_loadu_si128(in++);     // bgra4|bgra5|bgra6|bgra7
    const __m128i v0l = _mm_unpacklo_epi8(bgra0, bgra4);  // b0b4g0g4r0r4a0a4...
    const __m128i v0h = _mm_unpackhi_epi8(bgra0, bgra4);  // b2b6g2g6r2r6a2a6...
    const __m128i v1l = _mm_unpacklo_epi8(v0l, v0h);    // b0b2b4b6g0g2g4g6...
    const __m128i v1h = _mm_unpackhi_epi8(v0l, v0h);    // b1b3b5b7g1g3g5g7...
    const __m128i v2l = _mm_unpacklo_epi8(v1l, v1h);    // b0...b7 | g0...g7
    const __m128i v2h = _mm_unpackhi_epi8(v1l, v1h);    // r0...r7 | a0...a7
    const __m128i ga0 = _mm_unpackhi_epi64(v2l, v2h);   // g0...g7 | a0...a7
    const __m128i rb0 = _mm_unpacklo_epi64(v2h, v2l);   // r0...r7 | b0...b7
    const __m128i ga1 = _mm_srli_epi16(ga0, 4);         // g0-|g1-|...|a6-|a7-
    const __m128i rb1 = _mm_and_si128(rb0, mask_0xf0);  // -r0|-r1|...|-b6|-a7
    const __m128i ga2 = _mm_and_si128(ga1, mask_0x0f);  // g0-|g1-|...|a6-|a7-
    const __m128i rgba0 = _mm_or_si128(ga2, rb1);       // rg0..rg7 | ba0..ba7
    const __m128i rgba1 = _mm_srli_si128(rgba0, 8);     // ba0..ba7 | 0
#if (WEBP_SWAP_16BIT_CSP == 1)
    const __m128i rgba = _mm_unpacklo_epi8(rgba1, rgba0);  // barg0...barg7
#else
    const __m128i rgba = _mm_unpacklo_epi8(rgba0, rgba1);  // rgba0...rgba7
#endif
    _mm_storeu_si128(out++, rgba);
    num_pixels -= 8;
  }
  // left-overs
  if (num_pixels > 0) {
    VP8LConvertBGRAToRGBA4444_C((const uint32_t*)in, num_pixels, (uint8_t*)out);
  }
}